

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O1

bool __thiscall
bssl::hkdf_extract_to_secret
          (bssl *this,SSL_HANDSHAKE *hs,SSLTranscript *transcript,Span<const_unsigned_char> in)

{
  int iVar1;
  EVP_MD *digest;
  size_t len;
  ulong local_28;
  
  digest = SSLTranscript::Digest((SSLTranscript *)hs);
  iVar1 = HKDF_extract((uint8_t *)(this + 0x20),&local_28,digest,(uint8_t *)transcript,
                       (size_t)in.data_,(uint8_t *)(this + 0x20),(ulong)(byte)this[0x60]);
  if ((iVar1 != 0) && (local_28 != (byte)this[0x60])) {
    __assert_fail("len == hs->secret.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x3c,
                  "bool bssl::hkdf_extract_to_secret(SSL_HANDSHAKE *, const SSLTranscript &, Span<const uint8_t>)"
                 );
  }
  return iVar1 != 0;
}

Assistant:

static bool hkdf_extract_to_secret(SSL_HANDSHAKE *hs,
                                   const SSLTranscript &transcript,
                                   Span<const uint8_t> in) {
  size_t len;
  if (!HKDF_extract(hs->secret.data(), &len, transcript.Digest(), in.data(),
                    in.size(), hs->secret.data(), hs->secret.size())) {
    return false;
  }
  assert(len == hs->secret.size());
  return true;
}